

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QListWidgetItem * __thiscall QListWidget::itemAt(QListWidget *this,QPoint *p)

{
  QListWidgetItem *pQVar1;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QListWidgetPrivate *d;
  int row;
  QListModel *this_00;
  QListWidgetItem **local_8;
  
  local_8 = *(QListWidgetItem ***)(in_FS_OFFSET + 0x28);
  d_func((QListWidget *)0x89e2de);
  QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89e2ed);
  this_00 = (QListModel *)&stack0xffffffffffffffe0;
  (**(code **)(*in_RDI + 0x1f0))(this_00,in_RDI,in_RSI);
  row = (int)((ulong)in_RDI >> 0x20);
  QModelIndex::row((QModelIndex *)this_00);
  pQVar1 = QListModel::at(this_00,row);
  if (*(QListWidgetItem ***)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem *QListWidget::itemAt(const QPoint &p) const
{
    Q_D(const QListWidget);
    return d->listModel()->at(indexAt(p).row());

}